

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void pbrt::Log(LogLevel level,char *file,int line,char *s)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int len;
  FILE *__stream;
  string *psVar7;
  LogLevel in_stack_ffffffffffffff8c;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  char *local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  sVar3 = strlen(in_RCX);
  local_24 = (int)sVar3;
  if (local_24 != 0) {
    __stream = _stderr;
    uVar2 = getpid();
    puVar4 = (uint *)ThreadIndex();
    uVar1 = *puVar4;
    psVar7 = local_48;
    (anonymous_namespace)::TimeNow_abi_cxx11_();
    uVar5 = std::__cxx11::string::c_str();
    ToString_abi_cxx11_(in_stack_ffffffffffffff8c);
    uVar6 = std::__cxx11::string::c_str();
    fprintf(__stream,"[ %d.%03d %s %s:%d ] %s %s\n",(ulong)uVar2,(ulong)uVar1,uVar5,local_10,
            local_14,uVar6,local_20,__stream,uVar2,psVar7);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Log(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    auto strlen = [](const char *ptr) {
        int len = 0;
        while (*ptr) {
            ++len;
            ++ptr;
        }
        return len;
    };

    // Grab a slot
    int offset = atomicAdd(&nRawLogItems, 1);
    GPULogItem &item = rawLogItems[offset % MAX_LOG_ITEMS];
    item.level = level;

    // If the file name is too long to fit in GPULogItem.file, then copy
    // the trailing bits.
    int len = strlen(file);
    if (len + 1 > sizeof(item.file)) {
        int start = len - sizeof(item.file) + 1;
        if (start < 0)
            start = 0;
        for (int i = start; i < len; ++i)
            item.file[i - start] = file[i];
        item.file[len - start] = '\0';

        // Now clobber the start with "..." to show it was truncated
        item.file[0] = item.file[1] = item.file[2] = '.';
    } else {
        for (int i = 0; i < len; ++i)
            item.file[i] = file[i];
        item.file[len] = '\0';
    }

    item.line = line;

    // Copy as much of the message as we can...
    int i;
    for (i = 0; i < sizeof(item.message) - 1 && *s; ++i, ++s)
        item.message[i] = *s;
    item.message[i] = '\0';
#else
    int len = strlen(s);
    if (len == 0)
        return;
    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS, file, line,
            ToString(level).c_str(), s);
#endif
}